

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::DestroyProtos(RepeatedPtrFieldBase *this)

{
  uint uVar1;
  Rep *pRVar2;
  long *plVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  ulong uVar6;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (this->rep_ == (Rep *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0x66);
    pLVar4 = LogMessage::operator<<(&local_58,"CHECK failed: rep_: ");
    LogFinisher::operator=(&local_59,pLVar4);
    LogMessage::~LogMessage(&local_58);
  }
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0x67);
    pLVar4 = LogMessage::operator<<(&local_58,"CHECK failed: arena_ == nullptr: ");
    LogFinisher::operator=(&local_59,pLVar4);
    LogMessage::~LogMessage(&local_58);
  }
  pRVar2 = this->rep_;
  uVar1 = pRVar2->allocated_size;
  uVar5 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    plVar3 = (long *)pRVar2->elements[uVar5];
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  operator_delete(this->rep_);
  this->rep_ = (Rep *)0x0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::DestroyProtos() {
  GOOGLE_DCHECK(rep_);
  GOOGLE_DCHECK(arena_ == nullptr);
  int n = rep_->allocated_size;
  void* const* elements = rep_->elements;
  for (int i = 0; i < n; i++) {
    delete static_cast<MessageLite*>(elements[i]);
  }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
  const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
  ::operator delete(static_cast<void*>(rep_), size);
  rep_ = nullptr;
#else
  ::operator delete(static_cast<void*>(rep_));
  rep_ = nullptr;
#endif
}